

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O3

USTATUS __thiscall
FfsParser::parseCompressedSectionHeader
          (FfsParser *this,UByteArray *section,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index,bool insertIntoTree)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  UINT8 subtype;
  char cVar3;
  TreeModel *this_00;
  bool bVar4;
  UINT32 UVar5;
  USTATUS UVar6;
  uint uVar7;
  uint *puVar8;
  uint uVar9;
  undefined8 uVar10;
  UINT8 *ffsSize;
  byte *pbVar11;
  UByteArray local_110;
  CBString info;
  UModelIndex parentVolumeIndex;
  UByteArray header;
  CBString local_98;
  CBString name;
  UByteArray body;
  UModelIndex local_48;
  
  if (((section->d)._M_string_length & 0xfffffffc) == 0) {
    return 0x14;
  }
  TreeModel::findParentOfType(&parentVolumeIndex,this->model,parent,'A');
  if ((((parentVolumeIndex.r < 0) || (parentVolumeIndex.c < 0)) ||
      (parentVolumeIndex.m == (TreeModel *)0x0)) ||
     (bVar4 = TreeModel::hasEmptyParsingData(this->model,&parentVolumeIndex), bVar4)) {
    ffsSize = (UINT8 *)(section->d)._M_dataplus._M_p;
  }
  else {
    TreeModel::parsingData(&header,this->model,&parentVolumeIndex);
    cVar3 = header.d._M_dataplus._M_p[0x19];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)header.d._M_dataplus._M_p != &header.d.field_2) {
      operator_delete(header.d._M_dataplus._M_p);
    }
    ffsSize = (UINT8 *)(section->d)._M_dataplus._M_p;
    if ((cVar3 == '\x03') && (UVar5 = uint24ToUint32(ffsSize), UVar5 == 0xffffff)) {
      uVar7 = (uint)(section->d)._M_string_length;
      if (uVar7 < 0xd) {
        return 0x14;
      }
      puVar8 = (uint *)(ffsSize + 8);
      pbVar11 = ffsSize + 0xc;
      uVar10 = 0xd;
      goto LAB_0011ec61;
    }
  }
  puVar8 = (uint *)(ffsSize + 4);
  pbVar11 = ffsSize + 8;
  uVar7 = (uint)(section->d)._M_string_length;
  uVar10 = 9;
LAB_0011ec61:
  UVar6 = 0x14;
  uVar9 = (uint)uVar10;
  if (uVar9 <= uVar7) {
    uVar7 = *puVar8;
    bVar2 = *pbVar11;
    UByteArray::left(&header,section,uVar9);
    UByteArray::mid(&body,section,uVar9,-1);
    sectionTypeToUString((CBString *)&local_110,ffsSize[3]);
    Bstrlib::CBString::CBString(&info," section");
    Bstrlib::CBString::operator+(&name,(CBString *)&local_110,&info);
    Bstrlib::CBString::~CBString(&info);
    Bstrlib::CBString::~CBString((CBString *)&local_110);
    uVar9 = (uint)(section->d)._M_string_length;
    usprintf(&info,
             "Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nCompression type: %02Xh\nDecompressed size: %Xh (%u)"
             ,(ulong)ffsSize[3],(ulong)uVar9,(ulong)uVar9,uVar10,uVar10,
             (ulong)(uint)body.d._M_string_length,(ulong)(uint)body.d._M_string_length,(ulong)bVar2,
             (ulong)uVar7,(ulong)uVar7);
    if (insertIntoTree) {
      this_00 = this->model;
      subtype = ffsSize[3];
      Bstrlib::CBString::CBString(&local_98);
      paVar1 = &local_110.d.field_2;
      local_110.d._M_string_length = 0;
      local_110.d.field_2._M_allocated_capacity._0_4_ =
           local_110.d.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      local_110.d._M_dataplus._M_p = (pointer)paVar1;
      TreeModel::addItem(&local_48,this_00,localOffset,'C',subtype,&name,&local_98,&info,&header,
                         &body,&local_110,Movable,parent,'\0');
      index->m = local_48.m;
      index->r = local_48.r;
      index->c = local_48.c;
      index->i = local_48.i;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.d._M_dataplus._M_p != paVar1) {
        operator_delete(local_110.d._M_dataplus._M_p);
      }
      Bstrlib::CBString::~CBString(&local_98);
      local_110.d.field_2._9_3_ = 0;
      local_110.d.field_2._5_4_ = 0;
      local_110.d._M_string_length = 0xc;
      local_110.d.field_2._M_local_buf[0xc] = '\0';
      local_110.d._M_dataplus._M_p = (pointer)paVar1;
      local_110.d.field_2._M_allocated_capacity._0_4_ = uVar7;
      local_110.d.field_2._M_local_buf[4] = bVar2;
      TreeModel::setParsingData(this->model,index,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.d._M_dataplus._M_p != paVar1) {
        operator_delete(local_110.d._M_dataplus._M_p);
      }
    }
    Bstrlib::CBString::~CBString(&info);
    Bstrlib::CBString::~CBString(&name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)body.d._M_dataplus._M_p != &body.d.field_2) {
      operator_delete(body.d._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)header.d._M_dataplus._M_p != &header.d.field_2) {
      operator_delete(header.d._M_dataplus._M_p);
    }
    UVar6 = 0;
  }
  return UVar6;
}

Assistant:

USTATUS FfsParser::parseCompressedSectionHeader(const UByteArray & section, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index, const bool insertIntoTree)
{
    // Check sanity
    if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER))
        return U_INVALID_SECTION;
    
    // Obtain required information from parent volume
    UINT8 ffsVersion = 2;
    UModelIndex parentVolumeIndex = model->findParentOfType(parent, Types::Volume);
    if (parentVolumeIndex.isValid() && model->hasEmptyParsingData(parentVolumeIndex) == false) {
        UByteArray data = model->parsingData(parentVolumeIndex);
        const VOLUME_PARSING_DATA* pdata = (const VOLUME_PARSING_DATA*)data.constData();
        ffsVersion = pdata->ffsVersion;
    }
    
    // Obtain header fields
    UINT32 headerSize;
    UINT8 compressionType;
    UINT32 uncompressedLength;
    const EFI_COMMON_SECTION_HEADER* sectionHeader = (const EFI_COMMON_SECTION_HEADER*)(section.constData());
    const EFI_COMMON_SECTION_HEADER2* section2Header = (const EFI_COMMON_SECTION_HEADER2*)(section.constData());
    
    if (ffsVersion == 3 && uint24ToUint32(sectionHeader->Size) == EFI_SECTION2_IS_USED) { // Check for extended header section
        const EFI_COMPRESSION_SECTION* compressedSectionHeader = (const EFI_COMPRESSION_SECTION*)(section2Header + 1);
        if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_COMPRESSION_SECTION))
            return U_INVALID_SECTION;
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_COMPRESSION_SECTION);
        compressionType = compressedSectionHeader->CompressionType;
        uncompressedLength = compressedSectionHeader->UncompressedLength;
    }
    else { // Normal section
        const EFI_COMPRESSION_SECTION* compressedSectionHeader = (const EFI_COMPRESSION_SECTION*)(sectionHeader + 1);
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER) + sizeof(EFI_COMPRESSION_SECTION);
        compressionType = compressedSectionHeader->CompressionType;
        uncompressedLength = compressedSectionHeader->UncompressedLength;
    }
    
    // Check sanity again
    if ((UINT32)section.size() < headerSize) {
        return U_INVALID_SECTION;
    }
    
    UByteArray header = section.left(headerSize);
    UByteArray body = section.mid(headerSize);
    
    // Get info
    UString name = sectionTypeToUString(sectionHeader->Type) + UString(" section");
    UString info = usprintf("Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nCompression type: %02Xh\nDecompressed size: %Xh (%u)",
                            sectionHeader->Type,
                            (UINT32)section.size(), (UINT32)section.size(),
                            headerSize, headerSize,
                            (UINT32)body.size(), (UINT32)body.size(),
                            compressionType,
                            uncompressedLength, uncompressedLength);
    
    // Add tree item
    if (insertIntoTree) {
        index = model->addItem(localOffset, Types::Section, sectionHeader->Type, name, UString(), info, header, body, UByteArray(), Movable, parent);
        
        // Set section parsing data
        COMPRESSED_SECTION_PARSING_DATA pdata = {};
        pdata.compressionType = compressionType;
        pdata.uncompressedSize = uncompressedLength;
        model->setParsingData(index, UByteArray((const char*)&pdata, sizeof(pdata)));
    }
    
    return U_SUCCESS;
}